

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkset_tpl.h
# Opt level: O2

uint8_t * CHUNKCOPY_SAFE(uint8_t *out,uint8_t *from,uint64_t len,uint8_t *safe)

{
  uint8_t *puVar1;
  ulong uVar2;
  
  if (out != from) {
    uVar2 = (long)safe - (long)out;
    if (len <= (ulong)((long)safe - (long)out)) {
      uVar2 = len;
    }
    puVar1 = chunkmemset_avx512(out,from,(uint)uVar2);
    return puVar1;
  }
  return out + len;
}

Assistant:

static inline uint8_t *CHUNKCOPY_SAFE(uint8_t *out, uint8_t *from, uint64_t len, uint8_t *safe)
{
    if (out == from)
        return out + len;

    uint64_t safelen = (safe - out);
    len = MIN(len, safelen);

#ifndef HAVE_MASKED_READWRITE
    uint64_t from_dist = (uint64_t)llabs(safe - from);
    if (UNLIKELY(from_dist < sizeof(chunk_t) || safelen < sizeof(chunk_t))) {
        while (len--) {
            *out++ = *from++;
        }

        return out;
    }
#endif

    return CHUNKMEMSET(out, from, (unsigned)len);
}